

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ws_server.cpp
# Opt level: O0

error_or_n<const_gsl::span<std::uint8_t>_> *
pstore::http::details::decode_payload
          (error_or_n<const_gsl::span<std::uint8_t>_> *__return_storage_ptr__,
          uint64_t expected_length,span<const_unsigned_char,__1L> *mask,
          span<unsigned_char,__1L> *payload)

{
  byte bVar1;
  span<const_unsigned_char,__1L> *psVar2;
  byte *pbVar3;
  error_or<std::tuple<pstore::gsl::span<unsigned_char,__1L>_>_> local_68;
  long local_50;
  index_type ctr;
  index_type local_30;
  index_type size;
  span<unsigned_char,__1L> *payload_local;
  span<const_unsigned_char,__1L> *mask_local;
  uint64_t expected_length_local;
  
  size = (index_type)payload;
  payload_local = (span<unsigned_char,__1L> *)mask;
  mask_local = (span<const_unsigned_char,__1L> *)expected_length;
  expected_length_local = (uint64_t)__return_storage_ptr__;
  local_30 = pstore::gsl::span<unsigned_char,_-1L>::size(payload);
  if ((-1 < local_30) &&
     (psVar2 = (span<const_unsigned_char,__1L> *)unsigned_cast<long,unsigned_long,void>(local_30),
     psVar2 == mask_local)) {
    for (local_50 = 0; local_50 < local_30; local_50 = local_50 + 1) {
      pbVar3 = pstore::gsl::span<const_unsigned_char,_-1L>::operator[]
                         ((span<const_unsigned_char,__1L> *)payload_local,local_50 % 4);
      bVar1 = *pbVar3;
      pbVar3 = pstore::gsl::span<unsigned_char,_-1L>::operator[]
                         ((span<unsigned_char,__1L> *)size,local_50);
      *pbVar3 = *pbVar3 ^ bVar1;
    }
    error_or<std::tuple<pstore::gsl::span<unsigned_char,-1l>>>::
    error_or<pstore::gsl::span<unsigned_char,_1l>const&>
              ((error_or<std::tuple<pstore::gsl::span<unsigned_char,_1l>>> *)&local_68,size);
    error_or<std::tuple<pstore::gsl::span<unsigned_char,-1l>const>>::
    error_or<std::tuple<pstore::gsl::span<unsigned_char,_1l>>,void>
              ((error_or<std::tuple<pstore::gsl::span<unsigned_char,_1l>const>> *)
               __return_storage_ptr__,&local_68);
    error_or<std::tuple<pstore::gsl::span<unsigned_char,_-1L>_>_>::~error_or(&local_68);
    return __return_storage_ptr__;
  }
  error_or<std::tuple<pstore::gsl::span<unsigned_char,-1l>>>::error_or<pstore::http::ws_error,void>
            ((error_or<std::tuple<pstore::gsl::span<unsigned_char,_1l>>> *)&ctr,insufficient_data);
  error_or<std::tuple<pstore::gsl::span<unsigned_char,-1l>const>>::
  error_or<std::tuple<pstore::gsl::span<unsigned_char,_1l>>,void>
            ((error_or<std::tuple<pstore::gsl::span<unsigned_char,_1l>const>> *)
             __return_storage_ptr__,
             (error_or<std::tuple<pstore::gsl::span<unsigned_char,__1L>_>_> *)&ctr);
  error_or<std::tuple<pstore::gsl::span<unsigned_char,_-1L>_>_>::~error_or
            ((error_or<std::tuple<pstore::gsl::span<unsigned_char,__1L>_>_> *)&ctr);
  return __return_storage_ptr__;
}

Assistant:

error_or_n<gsl::span<std::uint8_t> const>
        details::decode_payload (std::uint64_t const expected_length,
                                 gsl::span<std::uint8_t const> const & mask,
                                 gsl::span<std::uint8_t> const & payload) {
            using return_type = error_or_n<gsl::span<std::uint8_t>>;
            auto const size = payload.size ();
            if (size < 0 || unsigned_cast (size) != expected_length) {
                return return_type{ws_error::insufficient_data};
            }

            // "Octet i of the transformed data ("transformed-octet-i") is the XOR of octet i of
            // the original data ("original-octet-i") with octet at index i modulo 4 of the
            // masking key ("masking-key-octet-j"):
            //     j                   = i MOD 4
            //     transformed-octet-i = original-octet-i XOR masking-key-octet-j"

            for (auto ctr = gsl::span<std::uint8_t>::index_type{0}; ctr < size; ++ctr) {
                payload[ctr] ^= mask[ctr % 4];
            }
            return return_type{in_place, payload};
        }